

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_sectors.cpp
# Opt level: O0

int __thiscall sector_t::FindMinSurroundingLight(sector_t *this,int min)

{
  sector_t_conflict *psVar1;
  sector_t_conflict *check;
  line_t_conflict *line;
  int i;
  int min_local;
  sector_t_conflict *this_local;
  
  line._4_4_ = min;
  for (line._0_4_ = 0; (int)line < this->linecount; line._0_4_ = (int)line + 1) {
    psVar1 = getNextSector(this->lines[(int)line],(sector_t_conflict *)this);
    if ((psVar1 != (sector_t_conflict *)0x0) && (psVar1->lightlevel < line._4_4_)) {
      line._4_4_ = (int)psVar1->lightlevel;
    }
  }
  return line._4_4_;
}

Assistant:

int sector_t::FindMinSurroundingLight (int min) const
{
	int 		i;
	line_t* 	line;
	sector_t*	check;
		
	for (i = 0; i < linecount; i++)
	{
		line = lines[i];
		if (NULL != (check = getNextSector (line, this)) &&
			check->lightlevel < min)
		{
			min = check->lightlevel;
		}
	}
	return min;
}